

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  
  vVar1 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>::
          fastAccessDx(&this->left_->fadexpr_,i);
  vVar2 = FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::val(&this->right_->fadexpr_);
  vVar3 = FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::fastAccessDx(&this->right_->fadexpr_,i);
  vVar4 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>::val
                    (&this->left_->fadexpr_);
  return vVar4 * vVar3 + vVar2 * vVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}